

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yprp_node_common1(lys_ypr_ctx_conflict *pctx,lysp_node *node,int8_t *flag)

{
  uint16_t *puVar1;
  lysp_ext_instance *plVar2;
  ly_stmt substmt;
  char *elem_name;
  lysp_ext_instance *plVar3;
  lysp_when *when;
  lysp_ext_instance *ext;
  uint64_t u;
  lysp_ext_instance *plVar4;
  
  elem_name = lys_nodetype2str(node->nodetype);
  ypr_open(pctx,elem_name,"name",node->name,*flag);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  substmt = lyplg_ext_nodetype2stmt(node->nodetype);
  plVar2 = node->exts;
  plVar4 = (lysp_ext_instance *)0x0;
  ext = plVar2;
  while( true ) {
    if (plVar2 == (lysp_ext_instance *)0x0) {
      plVar3 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar3 = plVar2[-1].exts;
    }
    if (plVar3 <= plVar4) break;
    yprp_extension_instance(pctx,substmt,'\0',ext,flag);
    plVar4 = (lysp_ext_instance *)((long)&plVar4->name + 1);
    ext = ext + 1;
  }
  when = lysp_node_when(node);
  yprp_when(pctx,when,flag);
  yprp_iffeatures(pctx,node->iffeatures,node->exts,flag);
  return;
}

Assistant:

static void
yprp_node_common1(struct lys_ypr_ctx *pctx, const struct lysp_node *node, int8_t *flag)
{
    ypr_open(pctx, lys_nodetype2str(node->nodetype), "name", node->name, *flag);
    LEVEL++;

    yprp_extension_instances(pctx, lyplg_ext_nodetype2stmt(node->nodetype), 0, node->exts, flag);
    yprp_when(pctx, lysp_node_when(node), flag);
    yprp_iffeatures(pctx, node->iffeatures, node->exts, flag);
}